

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O0

void pvip_free(pvip_t *pvip)

{
  PVIPNode *pPVar1;
  pvip_arena *ppVar2;
  PVIP_category_t PVar3;
  pvip_arena *next;
  PVIPNode *node;
  pvip_arena *ppStack_18;
  int i;
  pvip_arena *arena;
  pvip_t *pvip_local;
  
  ppStack_18 = pvip->arena;
  while (ppStack_18 != (pvip_arena *)0x0) {
    for (node._4_4_ = 0; node._4_4_ < ppStack_18->idx; node._4_4_ = node._4_4_ + 1) {
      pPVar1 = ppStack_18->nodes + node._4_4_;
      PVar3 = PVIP_node_category(pPVar1->type);
      switch(PVar3) {
      case PVIP_CATEGORY_UNKNOWN:
      case PVIP_CATEGORY_INT:
      case PVIP_CATEGORY_NUMBER:
        break;
      case PVIP_CATEGORY_STRING:
        PVIP_string_destroy((pPVar1->field_2).pv);
        break;
      case PVIP_CATEGORY_CHILDREN:
        free((pPVar1->field_2).children.nodes);
      }
    }
    ppVar2 = ppStack_18->next;
    free(ppStack_18);
    ppStack_18 = ppVar2;
  }
  free(pvip);
  return;
}

Assistant:

void pvip_free(struct pvip_t* pvip) {
    struct pvip_arena* arena = pvip->arena;
    while (arena) {
        int i;
        for (i=0; i<arena->idx; ++i) {
            PVIPNode* node = &(arena->nodes[i]);
            switch (PVIP_node_category(node->type)) {
            case PVIP_CATEGORY_CHILDREN:
                free(node->children.nodes);
                break;
            case PVIP_CATEGORY_STRING:
                PVIP_string_destroy(node->pv);
                break;
            case PVIP_CATEGORY_UNKNOWN:
            case PVIP_CATEGORY_INT:
            case PVIP_CATEGORY_NUMBER:
                break; // nop
            }
        }
        struct pvip_arena* next =  arena->next;
        free(arena);
        arena = next;
    }
    free(pvip);
}